

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

CURLcode Curl_add_custom_headers(Curl_easy *data,_Bool is_connect,int httpversion,dynbuf *req)

{
  char *pcVar1;
  bool bVar2;
  uchar uVar3;
  _Bool _Var4;
  int iVar5;
  CURLcode CVar6;
  void *pvVar7;
  long lVar8;
  curl_slist *pcVar9;
  undefined7 in_register_00000031;
  char *p;
  curl_slist *h [2];
  Curl_str name;
  Curl_str val;
  long local_88;
  char *local_70;
  curl_slist *local_68 [3];
  Curl_str local_50;
  Curl_str local_40;
  
  if ((int)CONCAT71(in_register_00000031,is_connect) == 0) {
    local_68[0] = (data->set).headers;
    local_88 = 1;
    if ((((ulong)data->conn->bits & 9) == 1) && (((data->set).field_0x89c & 0x40) != 0)) {
      local_68[1] = (data->set).proxyheaders;
      local_88 = 2;
    }
  }
  else {
    if (((data->set).field_0x89c & 0x40) == 0) {
      local_68[0] = (data->set).headers;
    }
    else {
      local_68[0] = (data->set).proxyheaders;
    }
    local_88 = 1;
  }
  lVar8 = 0;
  do {
    for (pcVar9 = local_68[lVar8]; pcVar9 != (curl_slist *)0x0; pcVar9 = pcVar9->next) {
      pcVar1 = pcVar9->data;
      local_70 = pcVar1;
      iVar5 = Curl_str_until(&local_70,&local_50,0x4b000,';');
      if ((((iVar5 == 0) && (iVar5 = Curl_str_single(&local_70,';'), iVar5 == 0)) &&
          (iVar5 = Curl_str_single(&local_70,'\0'), iVar5 == 0)) &&
         (pvVar7 = memchr(local_50.str,0x3a,CONCAT44(local_50.len._4_4_,(uint)local_50.len)),
         pvVar7 == (void *)0x0)) {
        bVar2 = true;
LAB_00135cbf:
        if (((data->state).aptr.host == (char *)0x0) ||
           (iVar5 = Curl_str_casecompare(&local_50,"Host"), iVar5 == 0)) {
          uVar3 = (data->state).httpreq;
          if (uVar3 == '\x02') {
            iVar5 = Curl_str_casecompare(&local_50,"Content-Type");
            if (iVar5 != 0) goto LAB_00135c8e;
            uVar3 = (data->state).httpreq;
          }
          if (((((uVar3 != '\x03') ||
                (iVar5 = Curl_str_casecompare(&local_50,"Content-Type"), iVar5 == 0)) &&
               ((((data->req).field_0xd3 & 4) == 0 ||
                (iVar5 = Curl_str_casecompare(&local_50,"Content-Length"), iVar5 == 0)))) &&
              ((((data->state).aptr.te == (char *)0x0 ||
                (iVar5 = Curl_str_casecompare(&local_50,"Connection"), iVar5 == 0)) &&
               ((httpversion < 0x14 ||
                (iVar5 = Curl_str_casecompare(&local_50,"Transfer-Encoding"), iVar5 == 0)))))) &&
             (((iVar5 = Curl_str_casecompare(&local_50,"Authorization"), iVar5 == 0 &&
               (iVar5 = Curl_str_casecompare(&local_50,"Cookie"), iVar5 == 0)) ||
              (_Var4 = Curl_auth_allowed_to_host(data), _Var4)))) {
            if (bVar2) {
              CVar6 = Curl_dyn_addf(req,"%.*s:\r\n",(ulong)(uint)local_50.len,local_50.str);
            }
            else {
              CVar6 = Curl_dyn_addf(req,"%s\r\n",pcVar1);
            }
            if (CVar6 != CURLE_OK) {
              return CVar6;
            }
          }
        }
      }
      else {
        local_70 = pcVar1;
        iVar5 = Curl_str_until(&local_70,&local_50,0x4b000,':');
        if ((iVar5 == 0) && (iVar5 = Curl_str_single(&local_70,':'), iVar5 == 0)) {
          Curl_str_untilnl(&local_70,&local_40,0x4b000);
          Curl_str_trimblanks(&local_40);
          if (local_40.len != 0) {
            bVar2 = false;
            goto LAB_00135cbf;
          }
        }
      }
LAB_00135c8e:
    }
    lVar8 = lVar8 + 1;
    if (lVar8 == local_88) {
      return CURLE_OK;
    }
  } while( true );
}

Assistant:

CURLcode Curl_add_custom_headers(struct Curl_easy *data,
                                 bool is_connect, int httpversion,
                                 struct dynbuf *req)
{
  struct curl_slist *h[2];
  struct curl_slist *headers;
  int numlists = 1; /* by default */
  int i;

#ifndef CURL_DISABLE_PROXY
  enum Curl_proxy_use proxy;

  if(is_connect)
    proxy = HEADER_CONNECT;
  else
    proxy = data->conn->bits.httpproxy && !data->conn->bits.tunnel_proxy ?
      HEADER_PROXY : HEADER_SERVER;

  switch(proxy) {
  case HEADER_SERVER:
    h[0] = data->set.headers;
    break;
  case HEADER_PROXY:
    h[0] = data->set.headers;
    if(data->set.sep_headers) {
      h[1] = data->set.proxyheaders;
      numlists++;
    }
    break;
  case HEADER_CONNECT:
    if(data->set.sep_headers)
      h[0] = data->set.proxyheaders;
    else
      h[0] = data->set.headers;
    break;
  }
#else
  (void)is_connect;
  h[0] = data->set.headers;
#endif

  /* loop through one or two lists */
  for(i = 0; i < numlists; i++) {
    for(headers = h[i]; headers; headers = headers->next) {
      CURLcode result = CURLE_OK;
      bool blankheader = FALSE;
      struct Curl_str name;
      const char *p = headers->data;
      const char *origp = p;

      /* explicitly asked to send header without content is done by a header
         that ends with a semicolon, but there must be no colon present in the
         name */
      if(!Curl_str_until(&p, &name, MAX_HTTP_RESP_HEADER_SIZE, ';') &&
         !Curl_str_single(&p, ';') &&
         !Curl_str_single(&p, '\0') &&
         !memchr(Curl_str(&name), ':', Curl_strlen(&name)))
        blankheader = TRUE;
      else {
        p = origp;
        if(!Curl_str_until(&p, &name, MAX_HTTP_RESP_HEADER_SIZE, ':') &&
           !Curl_str_single(&p, ':')) {
          struct Curl_str val;
          Curl_str_untilnl(&p, &val, MAX_HTTP_RESP_HEADER_SIZE);
          Curl_str_trimblanks(&val);
          if(!Curl_strlen(&val))
            /* no content, don't send this */
            continue;
        }
        else
          /* no colon */
          continue;
      }

      /* only send this if the contents was non-blank or done special */

      if(data->state.aptr.host &&
         /* a Host: header was sent already, do not pass on any custom
            Host: header as that will produce *two* in the same
            request! */
         Curl_str_casecompare(&name, "Host"))
        ;
      else if(data->state.httpreq == HTTPREQ_POST_FORM &&
              /* this header (extended by formdata.c) is sent later */
              Curl_str_casecompare(&name, "Content-Type"))
        ;
      else if(data->state.httpreq == HTTPREQ_POST_MIME &&
              /* this header is sent later */
              Curl_str_casecompare(&name, "Content-Type"))
        ;
      else if(data->req.authneg &&
              /* while doing auth neg, do not allow the custom length since
                 we will force length zero then */
              Curl_str_casecompare(&name, "Content-Length"))
        ;
      else if(data->state.aptr.te &&
              /* when asking for Transfer-Encoding, do not pass on a custom
                 Connection: */
              Curl_str_casecompare(&name, "Connection"))
        ;
      else if((httpversion >= 20) &&
              Curl_str_casecompare(&name, "Transfer-Encoding"))
        /* HTTP/2 does not support chunked requests */
        ;
      else if((Curl_str_casecompare(&name, "Authorization") ||
               Curl_str_casecompare(&name, "Cookie")) &&
              /* be careful of sending this potentially sensitive header to
                 other hosts */
              !Curl_auth_allowed_to_host(data))
        ;
      else if(blankheader)
        result = Curl_dyn_addf(req, "%.*s:\r\n", (int)Curl_strlen(&name),
                               Curl_str(&name));
      else
        result = Curl_dyn_addf(req, "%s\r\n", origp);

      if(result)
        return result;
    }
  }

  return CURLE_OK;
}